

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

int WebPValidateDecoderConfig(WebPDecoderConfig *config)

{
  int iVar1;
  int *in_RDI;
  int scaled_height;
  int scaled_width;
  WebPDecoderOptions *options;
  int *piVar2;
  int local_4;
  
  if (in_RDI == (int *)0x0) {
    local_4 = 0;
  }
  else {
    iVar1 = IsValidColorspace(in_RDI[10]);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      piVar2 = in_RDI + 0x28;
      if ((in_RDI[0x2a] == 0) ||
         (iVar1 = WebPCheckCropDimensionsBasic(in_RDI[0x2b],in_RDI[0x2c],in_RDI[0x2d],in_RDI[0x2e]),
         iVar1 != 0)) {
        if ((piVar2[7] == 0) ||
           (((-1 < piVar2[8] && (-1 < piVar2[9])) && ((piVar2[8] != 0 || (piVar2[9] != 0)))))) {
          if ((0 < *in_RDI) || (0 < in_RDI[1])) {
            if ((piVar2[2] != 0) &&
               (iVar1 = WebPCheckCropDimensions
                                  ((int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                                   (int)((ulong)piVar2 >> 0x20),(int)piVar2,piVar2[8],piVar2[9]),
               iVar1 == 0)) {
              return 0;
            }
            if ((piVar2[7] != 0) &&
               (iVar1 = WebPRescalerGetScaledDimensions
                                  (*in_RDI,in_RDI[1],(int *)&stack0xffffffffffffffe4,
                                   (int *)&stack0xffffffffffffffe0), iVar1 == 0)) {
              return 0;
            }
          }
          if ((((piVar2[0xb] < 0) || (100 < piVar2[0xb])) || (piVar2[0xd] < 0)) ||
             (100 < piVar2[0xd])) {
            local_4 = 0;
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int WebPValidateDecoderConfig(const WebPDecoderConfig* config) {
  const WebPDecoderOptions* options;
  if (config == NULL) return 0;
  if (!IsValidColorspace(config->output.colorspace)) {
    return 0;
  }

  options = &config->options;
  // bypass_filtering, no_fancy_upsampling, use_cropping, use_scaling,
  // use_threads, flip can be any integer and are interpreted as boolean.

  // Check for cropping.
  if (options->use_cropping && !WebPCheckCropDimensionsBasic(
                                   options->crop_left, options->crop_top,
                                   options->crop_width, options->crop_height)) {
    return 0;
  }
  // Check for scaling.
  if (options->use_scaling &&
      (options->scaled_width < 0 || options->scaled_height < 0 ||
       (options->scaled_width == 0 && options->scaled_height == 0))) {
    return 0;
  }

  // In case the WebPBitstreamFeatures has been filled in, check further.
  if (config->input.width > 0 || config->input.height > 0) {
    int scaled_width = options->scaled_width;
    int scaled_height = options->scaled_height;
    if (options->use_cropping &&
        !WebPCheckCropDimensions(config->input.width, config->input.height,
                                 options->crop_left, options->crop_top,
                                 options->crop_width, options->crop_height)) {
      return 0;
    }
    if (options->use_scaling && !WebPRescalerGetScaledDimensions(
                                    config->input.width, config->input.height,
                                    &scaled_width, &scaled_height)) {
      return 0;
    }
  }

  // Check for dithering.
  if (options->dithering_strength < 0 || options->dithering_strength > 100 ||
      options->alpha_dithering_strength < 0 ||
      options->alpha_dithering_strength > 100) {
    return 0;
  }

  return 1;
}